

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int send_session_ticket(ptls_t *tls,ptls_message_emitter_t *emitter)

{
  size_t *psVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint uVar4;
  st_ptls_hash_context_t *psVar5;
  ptls_context_t *ppVar6;
  size_t sVar7;
  ptls_key_schedule_t *ppVar8;
  size_t sVar9;
  char *pcVar10;
  char *pcVar11;
  st_ptls_get_time_t *psVar12;
  uint8_t *puVar13;
  st_ptls_encrypt_ticket_t *psVar14;
  short sVar15;
  short sVar16;
  ushort uVar17;
  int iVar18;
  uint64_t uVar19;
  size_t sVar20;
  long lVar21;
  anon_struct_176_2_4ca0e81c_for_traffic_protection *secret;
  uint8_t *puVar22;
  size_t sVar23;
  ptls_buffer_t *ppVar24;
  ptls_buffer_t *ppVar25;
  size_t sVar26;
  ptls_hash_context_t **pppVar27;
  ptls_iovec_t pVar28;
  uint16_t _v_1;
  uint16_t _v;
  uint32_t _v_2;
  uint32_t ticket_age_add;
  char session_id_smallbuf [128];
  ptls_buffer_t local_120;
  ptls_key_schedule_t *local_100;
  size_t local_f8;
  undefined1 *local_f0;
  uint local_e8;
  uint local_e4;
  char *local_e0;
  char *local_d8;
  size_t local_d0;
  size_t local_c8;
  st_ptls_hash_context_t *local_c0;
  uint8_t local_b8 [136];
  
  psVar5 = tls->key_schedule->hashes[0].ctx;
  local_c0 = (*psVar5->clone_)(psVar5);
  ppVar6 = tls->ctx;
  if (ppVar6->ticket_lifetime == 0) {
    __assert_fail("tls->ctx->ticket_lifetime != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/picotls.c"
                  ,0x54b,"int send_session_ticket(ptls_t *, ptls_message_emitter_t *)");
  }
  if (ppVar6->encrypt_ticket == (ptls_encrypt_ticket_t *)0x0) {
    __assert_fail("tls->ctx->encrypt_ticket != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/picotls.c"
                  ,0x54c,"int send_session_ticket(ptls_t *, ptls_message_emitter_t *)");
  }
  ppVar24 = emitter->buf;
  sVar7 = ppVar24->off;
  if ((tls->pending_handshake_secret != (uint8_t *)0x0) && ((ppVar6->field_0x68 & 0x10) == 0)) {
    if (tls->state != PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA) {
      __assert_fail("tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/lib/picotls.c"
                    ,0x551,"int send_session_ticket(ptls_t *, ptls_message_emitter_t *)");
    }
    ppVar8 = tls->key_schedule;
    ptls_buffer_reserve(ppVar24,1);
    ppVar24->base[ppVar24->off] = '\x05';
    ppVar24->off = ppVar24->off + 1;
    ptls_buffer_reserve(ppVar24,3);
    puVar22 = ppVar24->base;
    sVar26 = ppVar24->off;
    puVar22[sVar26 + 2] = '\0';
    puVar22 = puVar22 + sVar26;
    puVar22[0] = '\0';
    puVar22[1] = '\0';
    sVar26 = ppVar24->off;
    ppVar24->off = sVar26 + 3;
    lVar21 = -3;
    do {
      ppVar24->base[lVar21 + 3 + sVar26] = '\0';
      lVar21 = lVar21 + 1;
    } while (lVar21 != 0);
    if ((ppVar8 != (ptls_key_schedule_t *)0x0) && (ppVar8->num_hashes != 0)) {
      puVar22 = ppVar24->base;
      sVar26 = ppVar24->off;
      pppVar27 = &ppVar8->hashes[0].ctx;
      sVar23 = 0;
      do {
        (*(*pppVar27)->update)(*pppVar27,puVar22 + sVar7,sVar26 - sVar7);
        sVar23 = sVar23 + 1;
        pppVar27 = pppVar27 + 2;
      } while (sVar23 != ppVar8->num_hashes);
    }
    ppVar24 = emitter->buf;
    ppVar24->off = sVar7;
  }
  ppVar8 = tls->key_schedule;
  ptls_buffer_reserve(ppVar24,1);
  ppVar24->base[ppVar24->off] = '\x14';
  ppVar24->off = ppVar24->off + 1;
  ptls_buffer_reserve(ppVar24,3);
  puVar22 = ppVar24->base;
  sVar26 = ppVar24->off;
  puVar22[sVar26 + 2] = '\0';
  puVar22 = puVar22 + sVar26;
  puVar22[0] = '\0';
  puVar22[1] = '\0';
  sVar23 = ppVar24->off;
  sVar26 = sVar23 + 3;
  ppVar24->off = sVar26;
  ptls_buffer_reserve(emitter->buf,(tls->key_schedule->hashes[0].algo)->digest_size);
  secret = &tls->traffic_protection;
  if ((anon_struct_176_2_4ca0e81c_for_traffic_protection *)tls->pending_handshake_secret !=
      (anon_struct_176_2_4ca0e81c_for_traffic_protection *)0x0) {
    secret = (anon_struct_176_2_4ca0e81c_for_traffic_protection *)tls->pending_handshake_secret;
  }
  calc_verify_data(emitter->buf->base + emitter->buf->off,tls->key_schedule,secret);
  psVar1 = &emitter->buf->off;
  *psVar1 = *psVar1 + (tls->key_schedule->hashes[0].algo)->digest_size;
  sVar9 = ppVar24->off;
  lVar21 = 0x10;
  do {
    ppVar24->base[sVar23] = (uint8_t)(sVar9 - sVar26 >> ((byte)lVar21 & 0x3f));
    lVar21 = lVar21 + -8;
    sVar23 = sVar23 + 1;
  } while (lVar21 != -8);
  if ((ppVar8 != (ptls_key_schedule_t *)0x0) && (ppVar8->num_hashes != 0)) {
    puVar22 = ppVar24->base;
    sVar26 = ppVar24->off;
    pppVar27 = &ppVar8->hashes[0].ctx;
    sVar23 = 0;
    do {
      (*(*pppVar27)->update)(*pppVar27,puVar22 + sVar7,sVar26 - sVar7);
      sVar23 = sVar23 + 1;
      pppVar27 = pppVar27 + 2;
    } while (sVar23 != ppVar8->num_hashes);
  }
  emitter->buf->off = sVar7;
  (*tls->ctx->random_bytes)(&local_e4,4);
  uVar4 = local_e4;
  local_120.base = local_b8;
  local_120.off = 0;
  local_120.capacity = 0x80;
  local_120.is_allocated = 0;
  ppVar6 = tls->ctx;
  local_100 = tls->key_schedule;
  pcVar10 = tls->server_name;
  uVar2 = tls->key_share->id;
  uVar3 = tls->cipher_suite->id;
  pcVar11 = tls->negotiated_protocol;
  iVar18 = ptls_buffer_reserve(&local_120,2);
  sVar7 = local_120.off;
  puVar22 = local_120.base;
  if (iVar18 == 0) {
    local_f0 = (undefined1 *)CONCAT62(local_f0._2_6_,uVar2);
    local_f8 = CONCAT62(local_f8._2_6_,uVar3);
    local_e8 = uVar4;
    (local_120.base + local_120.off)[0] = '\0';
    (local_120.base + local_120.off)[1] = '\0';
    sVar26 = local_120.off + 2;
    local_120.off = sVar26;
    local_e0 = pcVar11;
    local_d8 = pcVar10;
    iVar18 = ptls_buffer_reserve(&local_120,8);
    puVar22 = local_120.base;
    if (iVar18 == 0) {
      local_c8 = sVar7;
      builtin_memcpy(local_120.base + local_120.off,"ptls0001",8);
      local_120.off = local_120.off + 8;
      psVar12 = ppVar6->get_time;
      local_d0 = sVar26;
      uVar19 = (*psVar12->cb)(psVar12);
      iVar18 = ptls_buffer_reserve(&local_120,8);
      puVar22 = local_120.base;
      if (iVar18 == 0) {
        *(uint64_t *)(local_120.base + local_120.off) =
             uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 |
             (uVar19 & 0xff0000000000) >> 0x18 | (uVar19 & 0xff00000000) >> 8 |
             (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 | (uVar19 & 0xff00) << 0x28 |
             uVar19 << 0x38;
        local_120.off = local_120.off + 8;
        iVar18 = ptls_buffer_reserve(&local_120,2);
        ppVar8 = local_100;
        sVar7 = local_120.off;
        puVar22 = local_120.base;
        if (iVar18 == 0) {
          (local_120.base + local_120.off)[0] = '\0';
          (local_120.base + local_120.off)[1] = '\0';
          sVar26 = local_120.off + 2;
          local_120.off = sVar26;
          iVar18 = ptls_buffer_reserve(&local_120,(local_100->hashes[0].algo)->digest_size);
          sVar23 = local_120.off;
          puVar22 = local_120.base;
          if ((iVar18 == 0) &&
             (iVar18 = derive_resumption_secret
                                 (ppVar8,local_120.base + local_120.off,(ptls_iovec_t)ZEXT816(0)),
             iVar18 == 0)) {
            local_120.off = sVar23 + (ppVar8->hashes[0].algo)->digest_size;
            lVar21 = local_120.off - sVar26;
            puVar22[sVar7] = (uint8_t)((ulong)lVar21 >> 8);
            puVar22[sVar7 + 1] = (uint8_t)lVar21;
            iVar18 = ptls_buffer_reserve(&local_120,2);
            puVar22 = local_120.base;
            if (iVar18 == 0) {
              *(ushort *)(local_120.base + local_120.off) =
                   (ushort)local_f0 << 8 | (ushort)local_f0 >> 8;
              local_120.off = local_120.off + 2;
              iVar18 = ptls_buffer_reserve(&local_120,2);
              puVar22 = local_120.base;
              if (iVar18 == 0) {
                *(ushort *)(local_120.base + local_120.off) =
                     (ushort)local_f8 << 8 | (ushort)local_f8 >> 8;
                local_120.off = local_120.off + 2;
                iVar18 = ptls_buffer_reserve(&local_120,4);
                puVar22 = local_120.base;
                if (iVar18 == 0) {
                  *(uint *)(local_120.base + local_120.off) =
                       local_e8 >> 0x18 | (local_e8 & 0xff0000) >> 8 | (local_e8 & 0xff00) << 8 |
                       local_e8 << 0x18;
                  local_120.off = local_120.off + 4;
                  iVar18 = ptls_buffer_reserve(&local_120,2);
                  pcVar10 = local_d8;
                  sVar7 = local_120.off;
                  puVar22 = local_120.base;
                  if (iVar18 == 0) {
                    (local_120.base + local_120.off)[0] = '\0';
                    (local_120.base + local_120.off)[1] = '\0';
                    local_120.off = local_120.off + 2;
                    sVar15 = (short)local_120.off;
                    sVar16 = sVar15;
                    if (local_d8 != (char *)0x0) {
                      sVar20 = strlen(local_d8);
                      iVar18 = ptls_buffer__do_pushv(&local_120,pcVar10,sVar20);
                      puVar22 = local_120.base;
                      if (iVar18 != 0) goto LAB_00116522;
                      sVar16 = (short)local_120.off;
                    }
                    uVar17 = sVar16 - sVar15;
                    *(ushort *)(local_120.base + sVar7) = uVar17 * 0x100 | uVar17 >> 8;
                    iVar18 = ptls_buffer_reserve(&local_120,1);
                    pcVar10 = local_e0;
                    sVar7 = local_120.off;
                    puVar22 = local_120.base;
                    if (iVar18 == 0) {
                      local_120.base[local_120.off] = '\0';
                      sVar26 = local_120.off + 1;
                      local_120.off = sVar26;
                      if (local_e0 != (char *)0x0) {
                        sVar20 = strlen(local_e0);
                        iVar18 = ptls_buffer__do_pushv(&local_120,pcVar10,sVar20);
                        puVar22 = local_120.base;
                        if (iVar18 != 0) goto LAB_00116522;
                      }
                      sVar23 = local_120.off;
                      puVar22 = local_120.base;
                      local_120.base[sVar7] = (char)local_120.off - (char)sVar26;
                      local_120.base[local_c8] = (uint8_t)(local_120.off - local_d0 >> 8);
                      local_120.base[local_c8 + 1] = (uint8_t)(local_120.off - local_d0);
                      iVar18 = (*emitter->begin_message)(emitter);
                      if (iVar18 == 0) {
                        ppVar24 = emitter->buf;
                        ppVar8 = tls->key_schedule;
                        sVar7 = ppVar24->off;
                        iVar18 = ptls_buffer_reserve(ppVar24,1);
                        if (iVar18 == 0) {
                          ppVar24->base[ppVar24->off] = '\x04';
                          ppVar24->off = ppVar24->off + 1;
                          iVar18 = ptls_buffer_reserve(ppVar24,3);
                          if (iVar18 == 0) {
                            puVar13 = ppVar24->base;
                            sVar26 = ppVar24->off;
                            puVar13[sVar26 + 2] = '\0';
                            puVar13 = puVar13 + sVar26;
                            puVar13[0] = '\0';
                            puVar13[1] = '\0';
                            local_100 = (ptls_key_schedule_t *)ppVar24->off;
                            local_f0 = (undefined1 *)((long)&local_100->generation + 3);
                            ppVar24->off = (size_t)local_f0;
                            uVar4 = tls->ctx->ticket_lifetime;
                            ppVar25 = emitter->buf;
                            iVar18 = ptls_buffer_reserve(ppVar25,4);
                            if (iVar18 == 0) {
                              *(uint *)(ppVar25->base + ppVar25->off) =
                                   uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                                   uVar4 << 0x18;
                              ppVar25->off = ppVar25->off + 4;
                              ppVar25 = emitter->buf;
                              iVar18 = ptls_buffer_reserve(ppVar25,4);
                              if (iVar18 == 0) {
                                *(uint *)(ppVar25->base + ppVar25->off) =
                                     local_e4 >> 0x18 | (local_e4 & 0xff0000) >> 8 |
                                     (local_e4 & 0xff00) << 8 | local_e4 << 0x18;
                                ppVar25->off = ppVar25->off + 4;
                                ppVar25 = emitter->buf;
                                iVar18 = ptls_buffer_reserve(ppVar25,1);
                                if (iVar18 == 0) {
                                  ppVar25->base[ppVar25->off] = '\0';
                                  ppVar25->off = ppVar25->off + 1;
                                  emitter->buf->base[emitter->buf->off - 1] = '\0';
                                  ppVar25 = emitter->buf;
                                  iVar18 = ptls_buffer_reserve(ppVar25,2);
                                  if (iVar18 == 0) {
                                    puVar13 = ppVar25->base;
                                    sVar26 = ppVar25->off;
                                    (puVar13 + sVar26)[0] = '\0';
                                    (puVar13 + sVar26)[1] = '\0';
                                    ppVar25->off = ppVar25->off + 2;
                                    sVar26 = emitter->buf->off;
                                    psVar14 = tls->ctx->encrypt_ticket;
                                    pVar28.len = sVar23;
                                    pVar28.base = puVar22;
                                    iVar18 = (*psVar14->cb)(psVar14,tls,1,emitter->buf,pVar28);
                                    if (iVar18 == 0) {
                                      lVar21 = emitter->buf->off - sVar26;
                                      emitter->buf->base[sVar26 - 2] = (uint8_t)((ulong)lVar21 >> 8)
                                      ;
                                      emitter->buf->base[sVar26 - 1] = (uint8_t)lVar21;
                                      ppVar25 = emitter->buf;
                                      iVar18 = ptls_buffer_reserve(ppVar25,2);
                                      if (iVar18 == 0) {
                                        puVar13 = ppVar25->base;
                                        sVar26 = ppVar25->off;
                                        (puVar13 + sVar26)[0] = '\0';
                                        (puVar13 + sVar26)[1] = '\0';
                                        ppVar25->off = ppVar25->off + 2;
                                        ppVar25 = emitter->buf;
                                        sVar26 = ppVar25->off;
                                        sVar23 = sVar26;
                                        if (tls->ctx->max_early_data_size != 0) {
                                          iVar18 = ptls_buffer_reserve(ppVar25,2);
                                          if (iVar18 != 0) goto LAB_00116522;
                                          puVar13 = ppVar25->base;
                                          sVar23 = ppVar25->off;
                                          (puVar13 + sVar23)[0] = '\0';
                                          (puVar13 + sVar23)[1] = '*';
                                          ppVar25->off = ppVar25->off + 2;
                                          ppVar25 = emitter->buf;
                                          iVar18 = ptls_buffer_reserve(ppVar25,2);
                                          if (iVar18 != 0) goto LAB_00116522;
                                          puVar13 = ppVar25->base;
                                          sVar23 = ppVar25->off;
                                          (puVar13 + sVar23)[0] = '\0';
                                          (puVar13 + sVar23)[1] = '\0';
                                          ppVar25->off = ppVar25->off + 2;
                                          ppVar25 = emitter->buf;
                                          local_f8 = ppVar25->off;
                                          uVar4 = tls->ctx->max_early_data_size;
                                          iVar18 = ptls_buffer_reserve(ppVar25,4);
                                          if (iVar18 != 0) goto LAB_00116522;
                                          *(uint *)(ppVar25->base + ppVar25->off) =
                                               uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 |
                                               (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
                                          ppVar25->off = ppVar25->off + 4;
                                          lVar21 = emitter->buf->off - local_f8;
                                          emitter->buf->base[local_f8 - 2] =
                                               (uint8_t)((ulong)lVar21 >> 8);
                                          emitter->buf->base[local_f8 - 1] = (uint8_t)lVar21;
                                          ppVar25 = emitter->buf;
                                          sVar23 = ppVar25->off;
                                        }
                                        ppVar25->base[sVar26 - 2] = (uint8_t)(sVar23 - sVar26 >> 8);
                                        emitter->buf->base[sVar26 - 1] = (uint8_t)(sVar23 - sVar26);
                                        sVar26 = ppVar24->off;
                                        lVar21 = 0x10;
                                        do {
                                          local_100->secret[(long)(ppVar24->base + -0x10)] =
                                               (uint8_t)(sVar26 - (long)local_f0 >>
                                                        ((byte)lVar21 & 0x3f));
                                          lVar21 = lVar21 + -8;
                                          local_100 = (ptls_key_schedule_t *)
                                                      ((long)&local_100->generation + 1);
                                        } while (lVar21 != -8);
                                        if ((ppVar8 != (ptls_key_schedule_t *)0x0) &&
                                           (ppVar8->num_hashes != 0)) {
                                          puVar13 = ppVar24->base;
                                          sVar26 = ppVar24->off;
                                          pppVar27 = &ppVar8->hashes[0].ctx;
                                          sVar23 = 0;
                                          do {
                                            (*(*pppVar27)->update)
                                                      (*pppVar27,puVar13 + sVar7,sVar26 - sVar7);
                                            sVar23 = sVar23 + 1;
                                            pppVar27 = pppVar27 + 2;
                                          } while (sVar23 != ppVar8->num_hashes);
                                        }
                                        iVar18 = (*emitter->commit_message)(emitter);
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00116522:
  (*ptls_clear_memory)(puVar22,local_120.off);
  if (local_120.is_allocated != 0) {
    free(puVar22);
  }
  psVar5 = tls->key_schedule->hashes[0].ctx;
  (*psVar5->final)(psVar5,(void *)0x0,PTLS_HASH_FINAL_MODE_FREE);
  tls->key_schedule->hashes[0].ctx = local_c0;
  return iVar18;
}

Assistant:

static int send_session_ticket(ptls_t *tls, ptls_message_emitter_t *emitter)
{
    ptls_hash_context_t *msghash_backup = tls->key_schedule->hashes[0].ctx->clone_(tls->key_schedule->hashes[0].ctx);
    ptls_buffer_t session_id;
    char session_id_smallbuf[128];
    uint32_t ticket_age_add;
    int ret = 0;

    assert(tls->ctx->ticket_lifetime != 0);
    assert(tls->ctx->encrypt_ticket != NULL);

    { /* calculate verify-data that will be sent by the client */
        size_t orig_off = emitter->buf->off;
        if (tls->pending_handshake_secret != NULL && !tls->ctx->omit_end_of_early_data) {
            assert(tls->state == PTLS_STATE_SERVER_EXPECT_END_OF_EARLY_DATA);
            ptls_buffer_push_message_body(emitter->buf, tls->key_schedule, PTLS_HANDSHAKE_TYPE_END_OF_EARLY_DATA, {});
            emitter->buf->off = orig_off;
        }
        ptls_buffer_push_message_body(emitter->buf, tls->key_schedule, PTLS_HANDSHAKE_TYPE_FINISHED, {
            if ((ret = ptls_buffer_reserve(emitter->buf, tls->key_schedule->hashes[0].algo->digest_size)) != 0)
                goto Exit;
            if ((ret = calc_verify_data(emitter->buf->base + emitter->buf->off, tls->key_schedule,
                                        tls->pending_handshake_secret != NULL ? tls->pending_handshake_secret
                                                                              : tls->traffic_protection.dec.secret)) != 0)
                goto Exit;
            emitter->buf->off += tls->key_schedule->hashes[0].algo->digest_size;
        });
        emitter->buf->off = orig_off;
    }

    tls->ctx->random_bytes(&ticket_age_add, sizeof(ticket_age_add));

    /* build the raw nsk */
    ptls_buffer_init(&session_id, session_id_smallbuf, sizeof(session_id_smallbuf));
    ret = encode_session_identifier(tls->ctx, &session_id, ticket_age_add, ptls_iovec_init(NULL, 0), tls->key_schedule,
                                    tls->server_name, tls->key_share->id, tls->cipher_suite->id, tls->negotiated_protocol);
    if (ret != 0)
        goto Exit;

    /* encrypt and send */
    ptls_push_message(emitter, tls->key_schedule, PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET, {
        ptls_buffer_push32(emitter->buf, tls->ctx->ticket_lifetime);
        ptls_buffer_push32(emitter->buf, ticket_age_add);
        ptls_buffer_push_block(emitter->buf, 1, {});
        ptls_buffer_push_block(emitter->buf, 2, {
            if ((ret = tls->ctx->encrypt_ticket->cb(tls->ctx->encrypt_ticket, tls, 1, emitter->buf,
                                                    ptls_iovec_init(session_id.base, session_id.off))) != 0)
                goto Exit;
        });
        ptls_buffer_push_block(emitter->buf, 2, {
            if (tls->ctx->max_early_data_size != 0)
                buffer_push_extension(emitter->buf, PTLS_EXTENSION_TYPE_EARLY_DATA,
                                      { ptls_buffer_push32(emitter->buf, tls->ctx->max_early_data_size); });
        });
    });

Exit:
    ptls_buffer_dispose(&session_id);

    /* restore handshake state */
    tls->key_schedule->hashes[0].ctx->final(tls->key_schedule->hashes[0].ctx, NULL, PTLS_HASH_FINAL_MODE_FREE);
    tls->key_schedule->hashes[0].ctx = msghash_backup;

    return ret;
}